

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ConditionalStatementSyntax::getChild(ConditionalStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  TokenOrSyntax *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x20),in_stack_ffffffffffffff78);
    break;
  case 2:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token);
    break;
  case 3:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_00);
    break;
  case 4:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_01);
    break;
  case 5:
    not_null<slang::syntax::ConditionalPredicateSyntax_*>::get
              ((not_null<slang::syntax::ConditionalPredicateSyntax_*> *)(in_RSI + 0x88));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 6:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_02);
    break;
  case 7:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 0xa0));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 8:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff88);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax ConditionalStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return uniqueOrPriority;
        case 3: return ifKeyword;
        case 4: return openParen;
        case 5: return predicate.get();
        case 6: return closeParen;
        case 7: return statement.get();
        case 8: return elseClause;
        default: return nullptr;
    }
}